

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coveragetobin.cpp
# Opt level: O2

void coveragetobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int coverage_id;
  OASIS_FLOAT tiv;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  iVar4 = 0;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = doscan(line,&coverage_id,&tiv);
    if (iVar1 != 2) break;
    if (iVar4 + 1U != coverage_id) {
      fprintf(_stderr,"FATAL: Expecting coverage id %d but got %d\n",(ulong)(iVar4 + 1U));
      exit(-1);
    }
    fwrite(&tiv,4,1,_stdout);
    uVar3 = uVar3 + 1;
    iVar4 = coverage_id;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
  return;
}

Assistant:

void doit()
	{

		int last_coverage_id = 0;
		char line[4096];
		int lineno = 0;
		fgets(line, sizeof(line), stdin);
		lineno++;

		while (fgets(line, sizeof(line), stdin) != 0)
		{
			int coverage_id;
			OASIS_FLOAT tiv;
			int ret = doscan(line, coverage_id, tiv);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
				return;
			}
			else
			{
				if ((last_coverage_id + 1) != coverage_id) {
					fprintf(stderr, "FATAL: Expecting coverage id %d but got %d\n", (last_coverage_id + 1), coverage_id);
					exit(-1);
				}
				fwrite(&tiv, sizeof(tiv), 1, stdout);
				last_coverage_id = coverage_id;
			}
			lineno++;
		}

	}